

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rhsUnscaled(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *lp,int i)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  cpp_dec_float<100U,_int,_void> *this_00;
  long in_FS_OFFSET;
  cpp_dec_float<100U,_int,_void> local_c8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  this_00 = &(lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  ::soplex::infinity::__tls_init();
  local_c8.fpclass = cpp_dec_float_finite;
  local_c8.prec_elem = 0x10;
  local_c8.data._M_elems[0] = 0;
  local_c8.data._M_elems[1] = 0;
  local_c8.data._M_elems[2] = 0;
  local_c8.data._M_elems[3] = 0;
  local_c8.data._M_elems[4] = 0;
  local_c8.data._M_elems[5] = 0;
  local_c8.data._M_elems[6] = 0;
  local_c8.data._M_elems[7] = 0;
  local_c8.data._M_elems[8] = 0;
  local_c8.data._M_elems[9] = 0;
  local_c8.data._M_elems[10] = 0;
  local_c8.data._M_elems[0xb] = 0;
  local_c8.data._M_elems[0xc] = 0;
  local_c8.data._M_elems[0xd] = 0;
  local_c8.data._M_elems._56_5_ = 0;
  local_c8.data._M_elems[0xf]._1_3_ = 0;
  local_c8.exp = 0;
  local_c8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_c8,*(double *)(in_FS_OFFSET + -8));
  if (((this_00->fpclass == cpp_dec_float_NaN) || (local_c8.fpclass == cpp_dec_float_NaN)) ||
     (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (this_00,&local_c8), -1 < iVar10)) {
    pnVar2 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = *(undefined8 *)&pnVar2[i].m_backend.data;
    uVar4 = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
    uVar5 = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x20);
    uVar7 = *(undefined8 *)puVar1;
    uVar8 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x30);
    uVar9 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1
    ;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) = uVar9;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = uVar7;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) = uVar8;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = uVar5;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar6;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar3;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar4;
    (__return_storage_ptr__->m_backend).exp = pnVar2[i].m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = pnVar2[i].m_backend.neg;
    local_c8.fpclass = pnVar2[i].m_backend.fpclass;
    local_c8.prec_elem = pnVar2[i].m_backend.prec_elem;
  }
  else {
    pnVar2 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_78 = *(undefined8 *)&pnVar2[i].m_backend.data;
    uStack_70 = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
    local_68 = *(undefined8 *)puVar1;
    uStack_60 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x20);
    local_58 = *(undefined8 *)puVar1;
    uStack_50 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x30);
    local_48 = *(undefined8 *)puVar1;
    uStack_40 = *(undefined8 *)(puVar1 + 2);
    local_38 = pnVar2[i].m_backend.exp;
    local_34 = pnVar2[i].m_backend.neg;
    local_30._0_4_ = pnVar2[i].m_backend.fpclass;
    local_30._4_4_ = pnVar2[i].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_c8,(soplex *)&local_78,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)-(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).scaleExp.data[i],CONCAT31((int3)((uint)local_38 >> 8),local_34));
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
         local_c8.data._M_elems._48_8_;
    *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_c8.data._M_elems[0xf]._1_3_,local_c8.data._M_elems._56_5_);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         local_c8.data._M_elems._32_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
         local_c8.data._M_elems._40_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_c8.data._M_elems._16_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         local_c8.data._M_elems._24_8_;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_c8.data._M_elems._0_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_c8.data._M_elems._8_8_;
    (__return_storage_ptr__->m_backend).exp = local_c8.exp;
    (__return_storage_ptr__->m_backend).neg = local_c8.neg;
  }
  (__return_storage_ptr__->m_backend).fpclass = local_c8.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_c8.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::rhsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(lp.isScaled());
   assert(i < lp.nRows());
   assert(i >= 0);

   if(lp.LPRowSetBase<R>::rhs(i) < R(infinity))
   {
      const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
      return spxLdexp(lp.LPRowSetBase<R>::rhs(i), -rowscaleExp[i]);
   }
   else
      return lp.LPRowSetBase<R>::rhs(i);
}